

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::RoundingImpl::apply
          (RoundingImpl *this,DecimalQuantity *value,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int32_t iVar6;
  
  if (this->fPassThrough != false) {
    return;
  }
  switch((this->fPrecision).fType) {
  case RND_BOGUS:
  case RND_ERROR:
    *status = U_INTERNAL_PROGRAM_ERROR;
    break;
  case RND_NONE:
    DecimalQuantity::roundToInfinity(value);
    return;
  case RND_FRACTION:
    iVar5 = (int)(this->fPrecision).fUnion.fracSig.fMaxFrac;
    iVar6 = -0x80000000;
    if (iVar5 != -1) {
      iVar6 = -iVar5;
    }
    DecimalQuantity::roundToMagnitude(value,iVar6,this->fRoundingMode,status);
    sVar1 = (this->fPrecision).fUnion.fracSig.fMinFrac;
    iVar5 = -0x7fffffff;
    if (sVar1 != 0) {
      iVar5 = (int)sVar1;
    }
    goto LAB_002a06e6;
  case RND_SIGNIFICANT:
    iVar6 = anon_unknown.dwarf_1b849b::getRoundingMagnitudeSignificant
                      (value,(int)(this->fPrecision).fUnion.fracSig.fMaxSig);
    DecimalQuantity::roundToMagnitude(value,iVar6,this->fRoundingMode,status);
    iVar6 = anon_unknown.dwarf_1b849b::getDisplayMagnitudeSignificant
                      (value,(int)(this->fPrecision).fUnion.fracSig.fMinSig);
    iVar6 = uprv_max_63(0,-iVar6);
    DecimalQuantity::setFractionLength(value,iVar6,0x7fffffff);
    bVar2 = DecimalQuantity::isZero(value);
    if ((bVar2) && (0 < (this->fPrecision).fUnion.fracSig.fMinSig)) {
      DecimalQuantity::setIntegerLength(value,1,0x7fffffff);
      return;
    }
    break;
  case RND_FRACTION_SIGNIFICANT:
    sVar1 = (this->fPrecision).fUnion.fracSig.fMinFrac;
    iVar5 = -0x7fffffff;
    if (sVar1 != 0) {
      iVar5 = (int)sVar1;
    }
    iVar3 = (int)(this->fPrecision).fUnion.fracSig.fMaxFrac;
    iVar6 = -0x80000000;
    if (iVar3 != -1) {
      iVar6 = -iVar3;
    }
    iVar3 = (int)(this->fPrecision).fUnion.fracSig.fMinSig;
    if (iVar3 == -1) {
      iVar4 = anon_unknown.dwarf_1b849b::getRoundingMagnitudeSignificant
                        (value,(int)(this->fPrecision).fUnion.fracSig.fMaxSig);
      iVar6 = uprv_max_63(iVar6,iVar4);
    }
    else {
      iVar4 = anon_unknown.dwarf_1b849b::getDisplayMagnitudeSignificant(value,iVar3);
      iVar6 = uprv_min_63(iVar6,iVar4);
    }
    DecimalQuantity::roundToMagnitude(value,iVar6,this->fRoundingMode,status);
LAB_002a06e6:
    iVar6 = uprv_max_63(0,iVar5);
LAB_002a06f0:
    DecimalQuantity::setFractionLength(value,iVar6,0x7fffffff);
    return;
  case RND_INCREMENT:
    DecimalQuantity::roundToIncrement
              (value,(this->fPrecision).fUnion.increment.fIncrement,this->fRoundingMode,
               (int)(this->fPrecision).fUnion.increment.fMaxFrac,status);
    iVar6 = (int32_t)(this->fPrecision).fUnion.increment.fMinFrac;
    goto LAB_002a06f0;
  }
  return;
}

Assistant:

void RoundingImpl::apply(impl::DecimalQuantity &value, UErrorCode& status) const {
    if (fPassThrough) {
        return;
    }
    switch (fPrecision.fType) {
        case Precision::RND_BOGUS:
        case Precision::RND_ERROR:
            // Errors should be caught before the apply() method is called
            status = U_INTERNAL_PROGRAM_ERROR;
            break;

        case Precision::RND_NONE:
            value.roundToInfinity();
            break;

        case Precision::RND_FRACTION:
            value.roundToMagnitude(
                    getRoundingMagnitudeFraction(fPrecision.fUnion.fracSig.fMaxFrac),
                    fRoundingMode,
                    status);
            value.setFractionLength(
                    uprv_max(0, -getDisplayMagnitudeFraction(fPrecision.fUnion.fracSig.fMinFrac)),
                    INT32_MAX);
            break;

        case Precision::RND_SIGNIFICANT:
            value.roundToMagnitude(
                    getRoundingMagnitudeSignificant(value, fPrecision.fUnion.fracSig.fMaxSig),
                    fRoundingMode,
                    status);
            value.setFractionLength(
                    uprv_max(0, -getDisplayMagnitudeSignificant(value, fPrecision.fUnion.fracSig.fMinSig)),
                    INT32_MAX);
            // Make sure that digits are displayed on zero.
            if (value.isZero() && fPrecision.fUnion.fracSig.fMinSig > 0) {
                value.setIntegerLength(1, INT32_MAX);
            }
            break;

        case Precision::RND_FRACTION_SIGNIFICANT: {
            int32_t displayMag = getDisplayMagnitudeFraction(fPrecision.fUnion.fracSig.fMinFrac);
            int32_t roundingMag = getRoundingMagnitudeFraction(fPrecision.fUnion.fracSig.fMaxFrac);
            if (fPrecision.fUnion.fracSig.fMinSig == -1) {
                // Max Sig override
                int32_t candidate = getRoundingMagnitudeSignificant(
                        value,
                        fPrecision.fUnion.fracSig.fMaxSig);
                roundingMag = uprv_max(roundingMag, candidate);
            } else {
                // Min Sig override
                int32_t candidate = getDisplayMagnitudeSignificant(
                        value,
                        fPrecision.fUnion.fracSig.fMinSig);
                roundingMag = uprv_min(roundingMag, candidate);
            }
            value.roundToMagnitude(roundingMag, fRoundingMode, status);
            value.setFractionLength(uprv_max(0, -displayMag), INT32_MAX);
            break;
        }

        case Precision::RND_INCREMENT:
            value.roundToIncrement(
                    fPrecision.fUnion.increment.fIncrement,
                    fRoundingMode,
                    fPrecision.fUnion.increment.fMaxFrac,
                    status);
            value.setFractionLength(fPrecision.fUnion.increment.fMinFrac, INT32_MAX);
            break;

        case Precision::RND_CURRENCY:
            // Call .withCurrency() before .apply()!
            U_ASSERT(false);
            break;
    }
}